

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sanity.cpp
# Opt level: O0

void __thiscall cubeb_init_destroy_stream_Test::TestBody(cubeb_init_destroy_stream_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  cubeb_stream_params params;
  cubeb_stream *stream;
  cubeb *ctx;
  int r;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffef4;
  int *in_stack_fffffffffffffef8;
  code *expected;
  Message *in_stack_ffffffffffffff00;
  code *this_00;
  char *in_stack_ffffffffffffff08;
  int *expected_expression;
  AssertHelper local_e8;
  Message local_e0;
  undefined8 local_d8;
  void **in_stack_ffffffffffffff30;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff38;
  AssertHelper in_stack_ffffffffffffff40;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  cubeb_stream **in_stack_ffffffffffffff58;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff60;
  AssertHelper local_98;
  Message local_90;
  undefined8 local_88;
  AssertionResult local_80;
  uint in_stack_ffffffffffffff90;
  uint uVar4;
  uint in_stack_ffffffffffffff98;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 uVar5;
  void *in_stack_ffffffffffffffb0;
  
  common_init((cubeb **)in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
  uVar5 = 0;
  testing::internal::EqHelper<false>::Compare<int,__0>
            (in_stack_ffffffffffffff08,(char *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
             (anon_enum_32 *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffffb0);
  if (!bVar1) {
    testing::Message::Message(in_stack_ffffffffffffff00);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x109940);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffff98,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
               ,0x9b,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffff98,(Message *)&stack0xffffffffffffffa0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff98);
    testing::Message::~Message((Message *)0x109990);
  }
  uVar4 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1099b5);
  if (uVar4 == 0) {
    local_88 = 0;
    testing::internal::CmpHelperNE<cubeb*,decltype(nullptr)>
              ((char *)in_stack_ffffffffffffff48.ptr_,(char *)in_stack_ffffffffffffff40.data_,
               (cubeb **)in_stack_ffffffffffffff38.ptr_,in_stack_ffffffffffffff30);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_80);
    if (!bVar1) {
      testing::Message::Message(in_stack_ffffffffffffff00);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x109a2d);
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
                 ,0x9c,pcVar2);
      testing::internal::AssertHelper::operator=(&local_98,&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      testing::Message::~Message((Message *)0x109a7d);
    }
    uVar4 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x109aa2);
    if (uVar4 == 0) {
      uVar3 = 0x113a;
      expected = test_data_callback;
      this_00 = test_state_callback;
      expected_expression = &dummy;
      cubeb_stream_init((cubeb *)in_stack_ffffffffffffff60.ptr_,in_stack_ffffffffffffff58,
                        (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                        in_stack_ffffffffffffff48.ptr_,
                        (cubeb_stream_params *)in_stack_ffffffffffffff40.data_,
                        in_stack_ffffffffffffff38.ptr_,
                        (cubeb_stream_params *)(ulong)in_stack_ffffffffffffff90,
                        in_stack_ffffffffffffff98,
                        (cubeb_data_callback)in_stack_ffffffffffffffa0.ptr_,
                        (cubeb_state_callback)CONCAT44(uVar5,in_stack_ffffffffffffffa8),
                        in_stack_ffffffffffffffb0);
      testing::internal::EqHelper<false>::Compare<int,__0>
                ((char *)expected_expression,(char *)this_00,(int *)expected,
                 (anon_enum_32 *)CONCAT44(in_stack_fffffffffffffef4,uVar3));
      bVar1 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xffffffffffffff58);
      if (!bVar1) {
        testing::Message::Message((Message *)this_00);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x109ba4);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xffffffffffffff40,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
                   ,0xa6,pcVar2);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xffffffffffffff40,(Message *)&stack0xffffffffffffff48);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff40);
        testing::Message::~Message((Message *)0x109be5);
      }
      uVar4 = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x109c07);
      if (uVar4 == 0) {
        local_d8 = 0;
        testing::internal::CmpHelperNE<cubeb_stream*,decltype(nullptr)>
                  ((char *)in_stack_ffffffffffffff48.ptr_,(char *)in_stack_ffffffffffffff40.data_,
                   (cubeb_stream **)in_stack_ffffffffffffff38.ptr_,in_stack_ffffffffffffff30);
        bVar1 = testing::AssertionResult::operator_cast_to_bool
                          ((AssertionResult *)&stack0xffffffffffffff30);
        if (!bVar1) {
          testing::Message::Message((Message *)this_00);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x109c6d);
          testing::internal::AssertHelper::AssertHelper
                    (&local_e8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
                     ,0xa7,pcVar2);
          testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
          testing::internal::AssertHelper::~AssertHelper(&local_e8);
          testing::Message::~Message((Message *)0x109cae);
        }
        uVar4 = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x109cd0);
        if (uVar4 == 0) {
          cubeb_stream_destroy((cubeb_stream *)0x109cec);
          cubeb_destroy((cubeb *)0x109cf9);
        }
      }
    }
  }
  return;
}

Assistant:

TEST(cubeb, init_destroy_stream)
{
  int r;
  cubeb * ctx;
  cubeb_stream * stream;
  cubeb_stream_params params;

  r = common_init(&ctx, "test_sanity");
  ASSERT_EQ(r, CUBEB_OK);
  ASSERT_NE(ctx, nullptr);

  params.format = STREAM_FORMAT;
  params.rate = STREAM_RATE;
  params.channels = STREAM_CHANNELS;
  params.layout = STREAM_LAYOUT;
  params.prefs = CUBEB_STREAM_PREF_NONE;

  r = cubeb_stream_init(ctx, &stream, "test", NULL, NULL, NULL, &params, STREAM_LATENCY,
                        test_data_callback, test_state_callback, &dummy);
  ASSERT_EQ(r, CUBEB_OK);
  ASSERT_NE(stream, nullptr);

  cubeb_stream_destroy(stream);
  cubeb_destroy(ctx);
}